

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O3

pair<double,_double>
Function_Template::template_ThresholdDouble
          (ThresholdDoubleForm2 Threshold,string *namespaceName,uint32_t size)

{
  uint8_t uVar1;
  uint uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint32_t i;
  pair<double,_double> pVar5;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  image;
  TimerContainer timer;
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  local_68;
  TimerContainer local_50;
  
  Test_Helper::uniformImages(&local_68,2,size,size);
  uVar2 = rand();
  uVar3 = rand();
  uVar1 = (uint8_t)uVar3;
  if ((uVar3 & 0xff) < (uVar2 & 0xff)) {
    uVar1 = (uint8_t)uVar2;
  }
  SetupFunction(namespaceName);
  Performance_Test::TimerContainer::TimerContainer(&local_50);
  uVar3 = 0;
  while( true ) {
    uVar4 = Test_Helper::runCount();
    if (uVar4 <= uVar3) break;
    Performance_Test::TimerContainer::start(&local_50);
    (*Threshold)(local_68.
                 super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_68.
                 super__Vector_base<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1,(uint8_t)uVar2,uVar1);
    Performance_Test::TimerContainer::stop(&local_50);
    uVar3 = uVar3 + 1;
  }
  CleanupFunction(namespaceName);
  pVar5 = Performance_Test::BaseTimerContainer::mean(&local_50.super_BaseTimerContainer);
  Performance_Test::TimerContainer::~TimerContainer(&local_50);
  std::
  vector<PenguinV_Image::ImageTemplate<unsigned_char>,_std::allocator<PenguinV_Image::ImageTemplate<unsigned_char>_>_>
  ::~vector(&local_68);
  return pVar5;
}

Assistant:

std::pair < double, double > template_ThresholdDouble( ThresholdDoubleForm2 Threshold, const std::string & namespaceName, uint32_t size )
    {
        std::vector < PenguinV_Image::Image > image = Performance_Test::uniformImages( 2, size, size );
        uint8_t minThreshold = Performance_Test::randomValue<uint8_t>( 256 );
        uint8_t maxThreshold = Performance_Test::randomValue<uint8_t>( minThreshold, 256 );

        TEST_FUNCTION_LOOP( Threshold( image[0], image[1], minThreshold, maxThreshold ), namespaceName )
    }